

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDImporter.cpp
# Opt level: O0

aiMesh * __thiscall
Assimp::MMDImporter::CreateMesh(MMDImporter *this,PmxModel *pModel,int indexStart,int indexCount)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  bool bVar8;
  aiMesh *this_00;
  ulong uVar9;
  ulong *puVar10;
  uint *puVar11;
  aiVector3D *paVar12;
  type piVar13;
  pointer pPVar14;
  mapped_type *pmVar15;
  ulong uVar16;
  aiBone *this_01;
  pointer ppVar17;
  size_type sVar18;
  aiVertexWeight *paVar19;
  reference pvVar20;
  aiFace *paVar21;
  ulong uVar22;
  aiVector3t<float> aVar23;
  aiVertexWeight *local_390;
  long local_320;
  long local_2c0;
  PmxVertexSkinningSDEF *local_2b0;
  PmxVertexSkinningBDEF4 *local_2a0;
  PmxVertexSkinningBDEF2 *local_290;
  aiVector3t<float> *local_258;
  aiVector3t<float> *local_230;
  aiVector3t<float> *local_208;
  aiVector3t<float> *local_1e0;
  aiFace *local_1b8;
  uint local_194;
  iterator iStack_190;
  uint j;
  _Self local_188;
  iterator it;
  _Base_ptr local_170;
  float local_168;
  undefined1 local_164 [8];
  aiVector3D pos;
  PmxBone *pmxBone;
  aiBone *pBone;
  aiBone **ppaStack_140;
  int ii;
  aiBone **bone_ptr_ptr;
  aiVertexWeight local_130;
  aiVertexWeight local_128;
  aiVertexWeight local_120;
  long local_118;
  PmxVertexSkinningQDEF *vsQDEF_ptr;
  aiVertexWeight local_108;
  aiVertexWeight local_100;
  aiVertexWeight local_f8;
  aiVertexWeight local_f0;
  aiVertexWeight local_e8;
  aiVertexWeight local_e0;
  aiVertexWeight local_d8;
  aiVertexWeight local_d0;
  long local_c8;
  PmxVertexSkinningSDEF *vsSDEF_ptr;
  PmxVertexSkinningBDEF4 *vsBDEF4_ptr;
  PmxVertexSkinningBDEF2 *vsBDEF2_ptr;
  PmxVertexSkinningBDEF1 *vsBDEF1_ptr;
  float *pfStack_a0;
  int i_1;
  float *normal;
  float *position;
  type local_80;
  PmxVertex *v;
  undefined1 local_70 [4];
  int index_1;
  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  bone_vertex_map;
  int i;
  uint *indices;
  uint index;
  int numIndices;
  aiMesh *pMesh;
  int indexCount_local;
  int indexStart_local;
  PmxModel *pModel_local;
  MMDImporter *this_local;
  
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  this_00->mNumVertices = indexCount;
  this_00->mNumFaces = indexCount / 3;
  uVar16 = CONCAT44(0,this_00->mNumFaces);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar16;
  uVar9 = SUB168(auVar1 * ZEXT816(0x10),0);
  uVar22 = uVar9 + 8;
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar9) {
    uVar22 = 0xffffffffffffffff;
  }
  puVar10 = (ulong *)operator_new__(uVar22);
  *puVar10 = uVar16;
  paVar21 = (aiFace *)(puVar10 + 1);
  if (uVar16 != 0) {
    local_1b8 = paVar21;
    do {
      aiFace::aiFace(local_1b8);
      local_1b8 = local_1b8 + 1;
    } while (local_1b8 != paVar21 + uVar16);
  }
  this_00->mFaces = paVar21;
  for (indices._0_4_ = 0; (uint)indices < this_00->mNumFaces; indices._0_4_ = (uint)indices + 1) {
    this_00->mFaces[(uint)indices].mNumIndices = 3;
    puVar11 = (uint *)operator_new__(0xc);
    *puVar11 = (uint)indices * 3;
    puVar11[1] = (uint)indices * 3 + 1;
    puVar11[2] = (uint)indices * 3 + 2;
    this_00->mFaces[(uint)indices].mIndices = puVar11;
  }
  uVar16 = CONCAT44(0,this_00->mNumVertices);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar16;
  uVar9 = SUB168(auVar2 * ZEXT816(0xc),0);
  if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  paVar12 = (aiVector3D *)operator_new__(uVar9);
  if (uVar16 != 0) {
    local_1e0 = paVar12;
    do {
      aiVector3t<float>::aiVector3t(local_1e0);
      local_1e0 = local_1e0 + 1;
    } while (local_1e0 != paVar12 + uVar16);
  }
  this_00->mVertices = paVar12;
  uVar16 = CONCAT44(0,this_00->mNumVertices);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar16;
  uVar9 = SUB168(auVar3 * ZEXT816(0xc),0);
  if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  paVar12 = (aiVector3D *)operator_new__(uVar9);
  if (uVar16 != 0) {
    local_208 = paVar12;
    do {
      aiVector3t<float>::aiVector3t(local_208);
      local_208 = local_208 + 1;
    } while (local_208 != paVar12 + uVar16);
  }
  this_00->mNormals = paVar12;
  uVar16 = CONCAT44(0,this_00->mNumVertices);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar16;
  uVar9 = SUB168(auVar4 * ZEXT816(0xc),0);
  if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  paVar12 = (aiVector3D *)operator_new__(uVar9);
  if (uVar16 != 0) {
    local_230 = paVar12;
    do {
      aiVector3t<float>::aiVector3t(local_230);
      local_230 = local_230 + 1;
    } while (local_230 != paVar12 + uVar16);
  }
  this_00->mTextureCoords[0] = paVar12;
  this_00->mNumUVComponents[0] = 2;
  for (bone_vertex_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
      bone_vertex_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ <=
      (int)(uint)(pModel->setting).uv;
      bone_vertex_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           bone_vertex_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    uVar16 = CONCAT44(0,this_00->mNumVertices);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar16;
    uVar9 = SUB168(auVar5 * ZEXT816(0xc),0);
    if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    paVar12 = (aiVector3D *)operator_new__(uVar9);
    if (uVar16 != 0) {
      local_258 = paVar12;
      do {
        aiVector3t<float>::aiVector3t(local_258);
        local_258 = local_258 + 1;
      } while (local_258 != paVar12 + uVar16);
    }
    this_00->mTextureCoords[bone_vertex_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_]
         = paVar12;
    this_00->mNumUVComponents
    [bone_vertex_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_] = 4;
  }
  std::
  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  ::map((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
         *)local_70);
  for (v._4_4_ = 0; (int)v._4_4_ < indexCount; v._4_4_ = v._4_4_ + 1) {
    piVar13 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                        (&pModel->indices,(long)(int)(indexStart + v._4_4_));
    normal = std::unique_ptr<pmx::PmxVertex[],_std::default_delete<pmx::PmxVertex[]>_>::operator[]
                       (&pModel->vertices,(long)*piVar13)->position;
    local_80 = (type)normal;
    aiVector3t<float>::Set
              (this_00->mVertices + (int)v._4_4_,((type)normal)->position[0],
               ((type)normal)->position[1],((type)normal)->position[2]);
    pfStack_a0 = local_80->normal;
    aiVector3t<float>::Set
              (this_00->mNormals + (int)v._4_4_,*pfStack_a0,local_80->normal[1],local_80->normal[2])
    ;
    this_00->mTextureCoords[0][(int)v._4_4_].x = local_80->uv[0];
    this_00->mTextureCoords[0][(int)v._4_4_].y = local_80->uv[1];
    for (vsBDEF1_ptr._4_4_ = 1; vsBDEF1_ptr._4_4_ <= (int)(uint)(pModel->setting).uv;
        vsBDEF1_ptr._4_4_ = vsBDEF1_ptr._4_4_ + 1) {
      this_00->mTextureCoords[vsBDEF1_ptr._4_4_][(int)v._4_4_].x =
           local_80->uva[vsBDEF1_ptr._4_4_][0];
      this_00->mTextureCoords[vsBDEF1_ptr._4_4_][(int)v._4_4_].y =
           local_80->uva[vsBDEF1_ptr._4_4_][1];
    }
    pPVar14 = std::unique_ptr<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>
              ::get(&local_80->skinning);
    if (pPVar14 == (pointer)0x0) {
      local_290 = (PmxVertexSkinningBDEF2 *)0x0;
    }
    else {
      local_290 = (PmxVertexSkinningBDEF2 *)
                  __dynamic_cast(pPVar14,&pmx::PmxVertexSkinning::typeinfo,
                                 &pmx::PmxVertexSkinningBDEF1::typeinfo,0);
    }
    vsBDEF2_ptr = local_290;
    pPVar14 = std::unique_ptr<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>
              ::get(&local_80->skinning);
    if (pPVar14 == (pointer)0x0) {
      local_2a0 = (PmxVertexSkinningBDEF4 *)0x0;
    }
    else {
      local_2a0 = (PmxVertexSkinningBDEF4 *)
                  __dynamic_cast(pPVar14,&pmx::PmxVertexSkinning::typeinfo,
                                 &pmx::PmxVertexSkinningBDEF2::typeinfo,0);
    }
    vsBDEF4_ptr = local_2a0;
    pPVar14 = std::unique_ptr<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>
              ::get(&local_80->skinning);
    if (pPVar14 == (pointer)0x0) {
      local_2b0 = (PmxVertexSkinningSDEF *)0x0;
    }
    else {
      local_2b0 = (PmxVertexSkinningSDEF *)
                  __dynamic_cast(pPVar14,&pmx::PmxVertexSkinning::typeinfo,
                                 &pmx::PmxVertexSkinningBDEF4::typeinfo,0);
    }
    vsSDEF_ptr = local_2b0;
    pPVar14 = std::unique_ptr<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>
              ::get(&local_80->skinning);
    if (pPVar14 == (pointer)0x0) {
      local_2c0 = 0;
    }
    else {
      local_2c0 = __dynamic_cast(pPVar14,&pmx::PmxVertexSkinning::typeinfo,
                                 &pmx::PmxVertexSkinningSDEF::typeinfo,0);
    }
    local_c8 = local_2c0;
    switch(local_80->skinning_type) {
    case BDEF1:
      pmVar15 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                              *)local_70,&vsBDEF2_ptr->bone_index1);
      aiVertexWeight::aiVertexWeight(&local_d0,v._4_4_,1.0);
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back(pmVar15,&local_d0);
      break;
    case BDEF2:
      pmVar15 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                              *)local_70,&vsBDEF4_ptr->bone_index1);
      aiVertexWeight::aiVertexWeight(&local_d8,v._4_4_,(float)vsBDEF4_ptr->bone_index3);
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back(pmVar15,&local_d8);
      pmVar15 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                              *)local_70,&vsBDEF4_ptr->bone_index2);
      aiVertexWeight::aiVertexWeight(&local_e0,v._4_4_,1.0 - (float)vsBDEF4_ptr->bone_index3);
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back(pmVar15,&local_e0);
      break;
    case BDEF4:
      pmVar15 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                              *)local_70,&vsSDEF_ptr->bone_index1);
      aiVertexWeight::aiVertexWeight(&local_e8,v._4_4_,vsSDEF_ptr->sdef_c[1]);
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back(pmVar15,&local_e8);
      pmVar15 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                              *)local_70,&vsSDEF_ptr->bone_index2);
      aiVertexWeight::aiVertexWeight(&local_f0,v._4_4_,vsSDEF_ptr->sdef_c[2]);
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back(pmVar15,&local_f0);
      pmVar15 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                              *)local_70,(key_type_conflict2 *)&vsSDEF_ptr->bone_weight);
      aiVertexWeight::aiVertexWeight(&local_f8,v._4_4_,vsSDEF_ptr->sdef_r0[0]);
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back(pmVar15,&local_f8);
      pmVar15 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                              *)local_70,(key_type_conflict2 *)vsSDEF_ptr->sdef_c);
      aiVertexWeight::aiVertexWeight(&local_100,v._4_4_,vsSDEF_ptr->sdef_r0[1]);
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back(pmVar15,&local_100);
      break;
    case SDEF:
      pmVar15 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                              *)local_70,(key_type_conflict2 *)(local_2c0 + 8));
      aiVertexWeight::aiVertexWeight(&local_108,v._4_4_,*(float *)(local_c8 + 0x10));
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back(pmVar15,&local_108);
      pmVar15 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                              *)local_70,(key_type_conflict2 *)(local_c8 + 0xc));
      aiVertexWeight::aiVertexWeight
                ((aiVertexWeight *)&vsQDEF_ptr,v._4_4_,1.0 - *(float *)(local_c8 + 0x10));
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back
                (pmVar15,(value_type *)&vsQDEF_ptr);
      break;
    case QDEF:
      pPVar14 = std::
                unique_ptr<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>::
                get(&local_80->skinning);
      if (pPVar14 == (pointer)0x0) {
        local_320 = 0;
      }
      else {
        local_320 = __dynamic_cast(pPVar14,&pmx::PmxVertexSkinning::typeinfo,
                                   &pmx::PmxVertexSkinningQDEF::typeinfo,0);
      }
      local_118 = local_320;
      pmVar15 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                              *)local_70,(key_type_conflict2 *)(local_320 + 8));
      aiVertexWeight::aiVertexWeight(&local_120,v._4_4_,*(float *)(local_118 + 0x18));
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back(pmVar15,&local_120);
      pmVar15 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                              *)local_70,(key_type_conflict2 *)(local_118 + 0xc));
      aiVertexWeight::aiVertexWeight(&local_128,v._4_4_,*(float *)(local_118 + 0x1c));
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back(pmVar15,&local_128);
      pmVar15 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                              *)local_70,(key_type_conflict2 *)(local_118 + 0x10));
      aiVertexWeight::aiVertexWeight(&local_130,v._4_4_,*(float *)(local_118 + 0x20));
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back(pmVar15,&local_130);
      pmVar15 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                              *)local_70,(key_type_conflict2 *)(local_118 + 0x14));
      aiVertexWeight::aiVertexWeight
                ((aiVertexWeight *)&bone_ptr_ptr,v._4_4_,*(float *)(local_118 + 0x24));
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back
                (pmVar15,(value_type *)&bone_ptr_ptr);
    }
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)pModel->bone_count;
  uVar16 = SUB168(auVar6 * ZEXT816(8),0);
  if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  ppaStack_140 = (aiBone **)operator_new__(uVar16);
  this_00->mNumBones = pModel->bone_count;
  this_00->mBones = ppaStack_140;
  for (pBone._4_4_ = 0; pBone._4_4_ < pModel->bone_count; pBone._4_4_ = pBone._4_4_ + 1) {
    this_01 = (aiBone *)operator_new(0x450);
    aiBone::aiBone(this_01);
    pos._4_8_ = std::unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_>::operator[]
                          (&pModel->bones,(long)pBone._4_4_);
    aiString::operator=((aiString *)this_01,(string *)pos._4_8_);
    aiVector3t<float>::aiVector3t
              ((aiVector3t<float> *)local_164,*(float *)(pos._4_8_ + 0x40),
               *(float *)(pos._4_8_ + 0x44),*(float *)(pos._4_8_ + 0x48));
    aVar23 = ::operator-((aiVector3t<float> *)local_164);
    local_168 = aVar23.z;
    it._M_node = aVar23._0_8_;
    local_170 = it._M_node;
    aiMatrix4x4t<float>::Translation((aiVector3t<float> *)&local_170,&this_01->mOffsetMatrix);
    local_188._M_node =
         (_Base_ptr)
         std::
         map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
         ::find((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                 *)local_70,(key_type_conflict2 *)((long)&pBone + 4));
    iStack_190 = std::
                 map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                 ::end((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                        *)local_70);
    bVar8 = std::operator!=(&local_188,&stack0xfffffffffffffe70);
    if (bVar8) {
      ppVar17 = std::
                _Rb_tree_iterator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                ::operator->(&local_188);
      sVar18 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size(&ppVar17->second);
      this_01->mNumWeights = (uint)sVar18;
      uVar16 = (ulong)this_01->mNumWeights;
      paVar19 = (aiVertexWeight *)operator_new__(uVar16 << 3);
      if (uVar16 != 0) {
        local_390 = paVar19;
        do {
          aiVertexWeight::aiVertexWeight(local_390);
          local_390 = local_390 + 1;
        } while (local_390 != paVar19 + uVar16);
      }
      this_01->mWeights = paVar19;
      for (local_194 = 0; local_194 < this_01->mNumWeights; local_194 = local_194 + 1) {
        ppVar17 = std::
                  _Rb_tree_iterator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                  ::operator->(&local_188);
        pvVar20 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::operator[]
                            (&ppVar17->second,(ulong)local_194);
        paVar19 = this_01->mWeights;
        fVar7 = pvVar20->mWeight;
        paVar19[local_194].mVertexId = pvVar20->mVertexId;
        paVar19[local_194].mWeight = fVar7;
      }
    }
    ppaStack_140[pBone._4_4_] = this_01;
  }
  std::
  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  ::~map((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
          *)local_70);
  return this_00;
}

Assistant:

aiMesh *MMDImporter::CreateMesh(const pmx::PmxModel *pModel,
                                const int indexStart, const int indexCount) {
  aiMesh *pMesh = new aiMesh;

  pMesh->mNumVertices = indexCount;

  pMesh->mNumFaces = indexCount / 3;
  pMesh->mFaces = new aiFace[pMesh->mNumFaces];

  const int numIndices = 3; // triangular face
  for (unsigned int index = 0; index < pMesh->mNumFaces; index++) {
    pMesh->mFaces[index].mNumIndices = numIndices;
    unsigned int *indices = new unsigned int[numIndices];
    indices[0] = numIndices * index;
    indices[1] = numIndices * index + 1;
    indices[2] = numIndices * index + 2;
    pMesh->mFaces[index].mIndices = indices;
  }

  pMesh->mVertices = new aiVector3D[pMesh->mNumVertices];
  pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
  pMesh->mTextureCoords[0] = new aiVector3D[pMesh->mNumVertices];
  pMesh->mNumUVComponents[0] = 2;

  // additional UVs
  for (int i = 1; i <= pModel->setting.uv; i++) {
    pMesh->mTextureCoords[i] = new aiVector3D[pMesh->mNumVertices];
    pMesh->mNumUVComponents[i] = 4;
  }

  map<int, vector<aiVertexWeight>> bone_vertex_map;

  // fill in contents and create bones
  for (int index = 0; index < indexCount; index++) {
    const pmx::PmxVertex *v =
        &pModel->vertices[pModel->indices[indexStart + index]];
    const float *position = v->position;
    pMesh->mVertices[index].Set(position[0], position[1], position[2]);
    const float *normal = v->normal;

    pMesh->mNormals[index].Set(normal[0], normal[1], normal[2]);
    pMesh->mTextureCoords[0][index].x = v->uv[0];
    pMesh->mTextureCoords[0][index].y = v->uv[1];

    for (int i = 1; i <= pModel->setting.uv; i++) {
      // TODO: wrong here? use quaternion transform?
      pMesh->mTextureCoords[i][index].x = v->uva[i][0];
      pMesh->mTextureCoords[i][index].y = v->uva[i][1];
    }

    // handle bone map
    const auto vsBDEF1_ptr =
        dynamic_cast<pmx::PmxVertexSkinningBDEF1 *>(v->skinning.get());
    const auto vsBDEF2_ptr =
        dynamic_cast<pmx::PmxVertexSkinningBDEF2 *>(v->skinning.get());
    const auto vsBDEF4_ptr =
        dynamic_cast<pmx::PmxVertexSkinningBDEF4 *>(v->skinning.get());
    const auto vsSDEF_ptr =
        dynamic_cast<pmx::PmxVertexSkinningSDEF *>(v->skinning.get());
    switch (v->skinning_type) {
    case pmx::PmxVertexSkinningType::BDEF1:
      bone_vertex_map[vsBDEF1_ptr->bone_index].push_back(
          aiVertexWeight(index, 1.0));
      break;
    case pmx::PmxVertexSkinningType::BDEF2:
      bone_vertex_map[vsBDEF2_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsBDEF2_ptr->bone_weight));
      bone_vertex_map[vsBDEF2_ptr->bone_index2].push_back(
          aiVertexWeight(index, 1.0f - vsBDEF2_ptr->bone_weight));
      break;
    case pmx::PmxVertexSkinningType::BDEF4:
      bone_vertex_map[vsBDEF4_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight1));
      bone_vertex_map[vsBDEF4_ptr->bone_index2].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight2));
      bone_vertex_map[vsBDEF4_ptr->bone_index3].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight3));
      bone_vertex_map[vsBDEF4_ptr->bone_index4].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight4));
      break;
    case pmx::PmxVertexSkinningType::SDEF: // TODO: how to use sdef_c, sdef_r0,
                                           // sdef_r1?
      bone_vertex_map[vsSDEF_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsSDEF_ptr->bone_weight));
      bone_vertex_map[vsSDEF_ptr->bone_index2].push_back(
          aiVertexWeight(index, 1.0f - vsSDEF_ptr->bone_weight));
      break;
    case pmx::PmxVertexSkinningType::QDEF:
      const auto vsQDEF_ptr =
          dynamic_cast<pmx::PmxVertexSkinningQDEF *>(v->skinning.get());
      bone_vertex_map[vsQDEF_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight1));
      bone_vertex_map[vsQDEF_ptr->bone_index2].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight2));
      bone_vertex_map[vsQDEF_ptr->bone_index3].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight3));
      bone_vertex_map[vsQDEF_ptr->bone_index4].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight4));
      break;
    }
  }

  // make all bones for each mesh
  // assign bone weights to skinned bones (otherwise just initialize)
  auto bone_ptr_ptr = new aiBone *[pModel->bone_count];
  pMesh->mNumBones = pModel->bone_count;
  pMesh->mBones = bone_ptr_ptr;
  for (auto ii = 0; ii < pModel->bone_count; ++ii) {
    auto pBone = new aiBone;
    const auto &pmxBone = pModel->bones[ii];
    pBone->mName = pmxBone.bone_name;
    aiVector3D pos(pmxBone.position[0], pmxBone.position[1], pmxBone.position[2]);
    aiMatrix4x4::Translation(-pos, pBone->mOffsetMatrix);
    auto it = bone_vertex_map.find(ii);
    if (it != bone_vertex_map.end()) {
      pBone->mNumWeights = static_cast<unsigned int>(it->second.size());
      pBone->mWeights = new aiVertexWeight[pBone->mNumWeights];
      for (unsigned int j = 0; j < pBone->mNumWeights; j++) {
          pBone->mWeights[j] = it->second[j];
      }
    }
    bone_ptr_ptr[ii] = pBone;
  }

  return pMesh;
}